

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  short sVar1;
  ushort *puVar5;
  short *psVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  parasail_result_t *ppVar13;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  size_t sVar18;
  ulong uVar19;
  size_t __n;
  uint uVar20;
  ulong uVar21;
  char *__format;
  undefined8 unaff_R15;
  bool bVar22;
  ushort uVar23;
  undefined4 uVar24;
  ulong uVar26;
  ushort uVar38;
  undefined1 auVar27 [16];
  undefined4 uVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i alVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar37;
  ushort uVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar40;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar42 [16];
  short sVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar58;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  undefined1 auVar59 [16];
  ushort uVar66;
  undefined1 auVar67 [16];
  ushort uVar68;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar69 [16];
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  __m128i c;
  uint local_124;
  ushort local_f8;
  ushort uStack_f6;
  ushort local_e8;
  ushort uStack_e6;
  ushort local_88;
  ushort uStack_86;
  short sVar2;
  short sVar3;
  short sVar4;
  size_t len;
  short sVar41;
  short sVar52;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile16.score";
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar12 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            iVar15 = ppVar8->min;
            iVar17 = -iVar15;
            if (iVar15 != -open && SBORROW4(iVar15,-open) == iVar15 + open < 0) {
              iVar17 = open;
            }
            iVar15 = ppVar8->max;
            ppVar13 = parasail_result_new();
            if (ppVar13 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar19 = uVar12 + 7 >> 3;
            ppVar13->flag = ppVar13->flag | 0x8200404;
            b = parasail_memalign___m128i(0x10,uVar19);
            ptr = parasail_memalign___m128i(0x10,uVar19);
            b_00 = parasail_memalign___m128i(0x10,uVar19);
            ptr_00 = parasail_memalign___m128i(0x10,uVar19);
            ptr_01 = parasail_memalign___m128i(0x10,uVar19);
            auVar27._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar27._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar27._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar27._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            iVar10 = movmskps((int)ptr_01,auVar27);
            if (iVar10 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar27 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar24 = auVar27._0_4_;
            auVar27 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar25 = auVar27._0_4_;
            local_124 = iVar17 - 0x7fff;
            auVar27 = pshuflw(ZEXT416(local_124),ZEXT416(local_124),0);
            auVar28 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R15 >> 0x10),0x7ffe - (short)iVar15
                                            ));
            auVar29 = pshuflw(auVar28,auVar28,0);
            uVar11 = local_124 & 0xffff;
            uVar20 = (uint)uVar19;
            uVar14 = -(gap * uVar20);
            len = (size_t)uVar14;
            auVar28 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
            uVar14 = auVar28._0_4_;
            auVar30._0_8_ = CONCAT44(uVar14,uVar14);
            auVar30._8_4_ = uVar14;
            auVar30._12_4_ = uVar14;
            auVar54._0_8_ = auVar30._0_8_ << 0x10;
            auVar54._8_8_ = auVar30._8_8_ << 0x10 | (ulong)(uVar14 >> 0x10);
            auVar30 = paddsw(auVar54,ZEXT416(uVar11));
            alVar31[1] = extraout_RDX;
            alVar31[0] = uVar19;
            parasail_memset___m128i(b_00,alVar31,len);
            c[1] = extraout_RDX_00;
            c[0] = uVar19;
            parasail_memset___m128i(b,c,len);
            auVar28._4_4_ = uVar25;
            auVar28._0_4_ = uVar25;
            auVar28._8_4_ = uVar25;
            auVar28._12_4_ = uVar25;
            auVar67._4_4_ = uVar24;
            auVar67._0_4_ = uVar24;
            auVar67._8_4_ = uVar24;
            auVar67._12_4_ = uVar24;
            alVar31 = (__m128i)psubsw((undefined1  [16])0x0,auVar67);
            for (uVar14 = uVar20 - 1; -1 < (int)uVar14; uVar14 = uVar14 - 1) {
              ptr_01[uVar14] = alVar31;
              alVar31 = (__m128i)psubsw((undefined1  [16])alVar31,auVar28);
            }
            __n = uVar19 << 4;
            local_88 = auVar29._0_2_;
            uStack_86 = auVar29._2_2_;
            local_f8 = auVar27._0_2_;
            uStack_f6 = auVar27._2_2_;
            uVar19 = 0;
            uVar68 = local_f8;
            uVar70 = uStack_f6;
            uVar71 = local_f8;
            uVar72 = uStack_f6;
            uVar73 = local_f8;
            uVar74 = uStack_f6;
            uVar75 = local_f8;
            uVar76 = uStack_f6;
            local_e8 = local_f8;
            uStack_e6 = uStack_f6;
            uVar23 = local_f8;
            uVar37 = uStack_f6;
            uVar38 = local_f8;
            uVar39 = uStack_f6;
            uVar47 = local_f8;
            uVar49 = uStack_f6;
            uVar85 = local_f8;
            uVar86 = uStack_f6;
            uVar87 = local_f8;
            uVar88 = uStack_f6;
            uVar89 = local_f8;
            uVar90 = uStack_f6;
            uVar91 = local_f8;
            uVar92 = uStack_f6;
            uVar77 = local_88;
            uVar78 = uStack_86;
            uVar79 = local_88;
            uVar80 = uStack_86;
            uVar81 = local_88;
            uVar82 = uStack_86;
            uVar83 = local_88;
            uVar84 = uStack_86;
            for (uVar21 = 0; iVar15 = (int)uVar19, uVar21 != (uint)s2Len; uVar21 = uVar21 + 1) {
              uVar26 = b_00[uVar20 - 1][0];
              auVar29._0_8_ = uVar26 << 0x10;
              auVar29._8_8_ = b_00[uVar20 - 1][1] << 0x10 | uVar26 >> 0x30;
              iVar15 = ppVar8->mapper[(byte)s2[uVar21]];
              auVar32 = (undefined1  [16])0x0;
              uVar40 = local_f8;
              uVar43 = uStack_f6;
              uVar44 = local_f8;
              uVar45 = uStack_f6;
              uVar46 = local_f8;
              uVar48 = uStack_f6;
              uVar50 = local_f8;
              uVar51 = uStack_f6;
              for (sVar18 = 0; __n != sVar18; sVar18 = sVar18 + 0x10) {
                auVar27 = *(undefined1 (*) [16])((long)*b_00 + sVar18);
                auVar57 = psubsw(*(undefined1 (*) [16])((long)*b + sVar18),auVar28);
                auVar59 = psubsw(auVar27,auVar67);
                auVar54 = paddsw(auVar29,*(undefined1 (*) [16])
                                          ((long)pvVar7 +
                                          sVar18 + (long)(int)(iVar15 * uVar20) * 0x10));
                auVar29 = paddsw(auVar32,*(undefined1 (*) [16])((long)*ptr_01 + sVar18));
                sVar53 = auVar57._0_2_;
                sVar41 = auVar59._0_2_;
                uVar58 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._2_2_;
                sVar41 = auVar59._2_2_;
                uVar60 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._4_2_;
                sVar41 = auVar59._4_2_;
                uVar61 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._6_2_;
                sVar41 = auVar59._6_2_;
                uVar62 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._8_2_;
                sVar41 = auVar59._8_2_;
                uVar63 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._10_2_;
                sVar41 = auVar59._10_2_;
                uVar64 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._12_2_;
                sVar41 = auVar59._12_2_;
                sVar52 = auVar59._14_2_;
                uVar65 = (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar57._14_2_;
                uVar66 = (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
                sVar53 = auVar29._0_2_;
                uVar40 = (ushort)((short)uVar40 < sVar53) * sVar53 |
                         ((short)uVar40 >= sVar53) * uVar40;
                sVar53 = auVar29._2_2_;
                uVar43 = (ushort)((short)uVar43 < sVar53) * sVar53 |
                         ((short)uVar43 >= sVar53) * uVar43;
                sVar53 = auVar29._4_2_;
                uVar44 = (ushort)((short)uVar44 < sVar53) * sVar53 |
                         ((short)uVar44 >= sVar53) * uVar44;
                sVar53 = auVar29._6_2_;
                uVar45 = (ushort)((short)uVar45 < sVar53) * sVar53 |
                         ((short)uVar45 >= sVar53) * uVar45;
                sVar53 = auVar29._8_2_;
                uVar46 = (ushort)((short)uVar46 < sVar53) * sVar53 |
                         ((short)uVar46 >= sVar53) * uVar46;
                sVar53 = auVar29._10_2_;
                uVar48 = (ushort)((short)uVar48 < sVar53) * sVar53 |
                         ((short)uVar48 >= sVar53) * uVar48;
                sVar53 = auVar29._12_2_;
                uVar50 = (ushort)((short)uVar50 < sVar53) * sVar53 |
                         ((short)uVar50 >= sVar53) * uVar50;
                sVar53 = auVar29._14_2_;
                uVar51 = (ushort)((short)uVar51 < sVar53) * sVar53 |
                         ((short)uVar51 >= sVar53) * uVar51;
                sVar53 = auVar54._0_2_;
                auVar32._0_2_ =
                     (sVar53 < (short)uVar58) * uVar58 | (ushort)(sVar53 >= (short)uVar58) * sVar53;
                sVar53 = auVar54._2_2_;
                auVar32._2_2_ =
                     (sVar53 < (short)uVar60) * uVar60 | (ushort)(sVar53 >= (short)uVar60) * sVar53;
                sVar53 = auVar54._4_2_;
                auVar32._4_2_ =
                     (sVar53 < (short)uVar61) * uVar61 | (ushort)(sVar53 >= (short)uVar61) * sVar53;
                sVar53 = auVar54._6_2_;
                auVar32._6_2_ =
                     (sVar53 < (short)uVar62) * uVar62 | (ushort)(sVar53 >= (short)uVar62) * sVar53;
                sVar53 = auVar54._8_2_;
                auVar32._8_2_ =
                     (sVar53 < (short)uVar63) * uVar63 | (ushort)(sVar53 >= (short)uVar63) * sVar53;
                sVar53 = auVar54._10_2_;
                auVar32._10_2_ =
                     (sVar53 < (short)uVar64) * uVar64 | (ushort)(sVar53 >= (short)uVar64) * sVar53;
                sVar53 = auVar54._12_2_;
                sVar41 = auVar54._14_2_;
                auVar32._12_2_ =
                     (sVar53 < (short)uVar65) * uVar65 | (ushort)(sVar53 >= (short)uVar65) * sVar53;
                auVar32._14_2_ =
                     (sVar41 < (short)uVar66) * uVar66 | (ushort)(sVar41 >= (short)uVar66) * sVar41;
                puVar5 = (ushort *)((long)*b + sVar18);
                *puVar5 = uVar58;
                puVar5[1] = uVar60;
                puVar5[2] = uVar61;
                puVar5[3] = uVar62;
                puVar5[4] = uVar63;
                puVar5[5] = uVar64;
                puVar5[6] = uVar65;
                puVar5[7] = uVar66;
                *(undefined1 (*) [16])((long)*ptr + sVar18) = auVar32;
                auVar29 = auVar27;
              }
              uVar26 = auVar32._0_8_;
              auVar59._0_8_ = uVar26 << 0x10;
              auVar59._8_8_ = auVar32._8_8_ << 0x10 | uVar26 >> 0x30;
              auVar27 = paddsw((undefined1  [16])*ptr_01,auVar59);
              sVar53 = auVar27._0_2_;
              auVar57._0_2_ =
                   (ushort)((short)uVar40 < sVar53) * sVar53 | ((short)uVar40 >= sVar53) * uVar40;
              sVar53 = auVar27._2_2_;
              auVar57._2_2_ =
                   (ushort)((short)uVar43 < sVar53) * sVar53 | ((short)uVar43 >= sVar53) * uVar43;
              sVar53 = auVar27._4_2_;
              auVar57._4_2_ =
                   (ushort)((short)uVar44 < sVar53) * sVar53 | ((short)uVar44 >= sVar53) * uVar44;
              sVar53 = auVar27._6_2_;
              auVar57._6_2_ =
                   (ushort)((short)uVar45 < sVar53) * sVar53 | ((short)uVar45 >= sVar53) * uVar45;
              sVar53 = auVar27._8_2_;
              auVar57._8_2_ =
                   (ushort)((short)uVar46 < sVar53) * sVar53 | ((short)uVar46 >= sVar53) * uVar46;
              sVar53 = auVar27._10_2_;
              auVar57._10_2_ =
                   (ushort)((short)uVar48 < sVar53) * sVar53 | ((short)uVar48 >= sVar53) * uVar48;
              sVar53 = auVar27._12_2_;
              auVar57._12_2_ =
                   (ushort)((short)uVar50 < sVar53) * sVar53 | ((short)uVar50 >= sVar53) * uVar50;
              sVar53 = auVar27._14_2_;
              auVar57._14_2_ =
                   (ushort)((short)uVar51 < sVar53) * sVar53 | ((short)uVar51 >= sVar53) * uVar51;
              iVar15 = 6;
              while( true ) {
                auVar55._0_8_ = auVar57._0_8_ << 0x10;
                auVar55._8_8_ = auVar57._8_8_ << 0x10 | auVar57._0_8_ >> 0x30;
                bVar22 = iVar15 == 0;
                iVar15 = iVar15 + -1;
                if (bVar22) break;
                auVar27 = paddsw(auVar55,auVar30);
                sVar53 = auVar27._0_2_;
                sVar41 = auVar57._0_2_;
                auVar42._0_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._2_2_;
                sVar41 = auVar57._2_2_;
                auVar42._2_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._4_2_;
                sVar41 = auVar57._4_2_;
                auVar42._4_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._6_2_;
                sVar41 = auVar57._6_2_;
                auVar42._6_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._8_2_;
                sVar41 = auVar57._8_2_;
                auVar42._8_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._10_2_;
                sVar41 = auVar57._10_2_;
                auVar42._10_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._12_2_;
                sVar41 = auVar57._12_2_;
                sVar52 = auVar57._14_2_;
                auVar42._12_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._14_2_;
                auVar42._14_2_ =
                     (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
                auVar57 = auVar42;
              }
              auVar56 = paddsw(auVar55,ZEXT416(uVar11));
              sVar1 = (ushort)(-1 < auVar32._0_2_) * auVar32._0_2_;
              sVar2 = (ushort)(-1 < auVar32._2_2_) * auVar32._2_2_;
              sVar3 = (ushort)(-1 < auVar59._0_8_) * auVar32._4_2_;
              sVar4 = (ushort)(-1 < (long)uVar26) * auVar32._6_2_;
              sVar52 = (ushort)(-1 < auVar32._8_2_) * auVar32._8_2_;
              sVar41 = (ushort)(-1 < auVar32._10_2_) * auVar32._10_2_;
              sVar53 = (ushort)(-1 < (long)auVar59._8_8_) * auVar32._12_2_;
              sVar9 = auVar56._2_2_;
              auVar33._2_2_ = (ushort)(sVar1 < sVar9) * sVar9 | (ushort)(sVar1 >= sVar9) * sVar1;
              auVar33._0_2_ = (ushort)(0 < auVar56._0_2_) * auVar56._0_2_;
              sVar1 = auVar56._4_2_;
              auVar33._4_2_ = (ushort)(sVar2 < sVar1) * sVar1 | (ushort)(sVar2 >= sVar1) * sVar2;
              sVar2 = auVar56._6_2_;
              auVar33._6_2_ = (ushort)(sVar3 < sVar2) * sVar2 | (ushort)(sVar3 >= sVar2) * sVar3;
              sVar3 = auVar56._8_2_;
              auVar33._8_2_ = (ushort)(sVar4 < sVar3) * sVar3 | (ushort)(sVar4 >= sVar3) * sVar4;
              sVar4 = auVar56._10_2_;
              auVar33._10_2_ = (ushort)(sVar52 < sVar4) * sVar4 | (ushort)(sVar52 >= sVar4) * sVar52
              ;
              sVar52 = auVar56._12_2_;
              auVar33._12_2_ =
                   (ushort)(sVar41 < sVar52) * sVar52 | (ushort)(sVar41 >= sVar52) * sVar41;
              sVar41 = auVar56._14_2_;
              auVar33._14_2_ =
                   (ushort)(sVar53 < sVar41) * sVar41 | (ushort)(sVar53 >= sVar41) * sVar53;
              for (sVar18 = 0; __n != sVar18; sVar18 = sVar18 + 0x10) {
                auVar29 = psubsw(auVar56,auVar28);
                auVar27 = psubsw(auVar33,auVar67);
                sVar53 = auVar27._0_2_;
                sVar41 = auVar29._0_2_;
                auVar56._0_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._2_2_;
                sVar41 = auVar29._2_2_;
                auVar56._2_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._4_2_;
                sVar41 = auVar29._4_2_;
                auVar56._4_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._6_2_;
                sVar41 = auVar29._6_2_;
                auVar56._6_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._8_2_;
                sVar41 = auVar29._8_2_;
                auVar56._8_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._10_2_;
                sVar41 = auVar29._10_2_;
                auVar56._10_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._12_2_;
                sVar41 = auVar29._12_2_;
                sVar52 = auVar29._14_2_;
                auVar56._12_2_ =
                     (ushort)(sVar41 < sVar53) * sVar53 | (ushort)(sVar41 >= sVar53) * sVar41;
                sVar53 = auVar27._14_2_;
                auVar56._14_2_ =
                     (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
                psVar6 = (short *)((long)*ptr + sVar18);
                sVar53 = *psVar6;
                sVar41 = psVar6[1];
                sVar52 = psVar6[2];
                sVar4 = psVar6[3];
                sVar3 = psVar6[4];
                sVar2 = psVar6[5];
                sVar1 = psVar6[6];
                sVar9 = psVar6[7];
                uVar40 = (sVar53 < (short)auVar56._0_2_) * auVar56._0_2_ |
                         (ushort)(sVar53 >= (short)auVar56._0_2_) * sVar53;
                uVar43 = (sVar41 < (short)auVar56._2_2_) * auVar56._2_2_ |
                         (ushort)(sVar41 >= (short)auVar56._2_2_) * sVar41;
                uVar44 = (sVar52 < (short)auVar56._4_2_) * auVar56._4_2_ |
                         (ushort)(sVar52 >= (short)auVar56._4_2_) * sVar52;
                uVar45 = (sVar4 < (short)auVar56._6_2_) * auVar56._6_2_ |
                         (ushort)(sVar4 >= (short)auVar56._6_2_) * sVar4;
                uVar46 = (sVar3 < (short)auVar56._8_2_) * auVar56._8_2_ |
                         (ushort)(sVar3 >= (short)auVar56._8_2_) * sVar3;
                uVar48 = (sVar2 < (short)auVar56._10_2_) * auVar56._10_2_ |
                         (ushort)(sVar2 >= (short)auVar56._10_2_) * sVar2;
                uVar50 = (sVar1 < (short)auVar56._12_2_) * auVar56._12_2_ |
                         (ushort)(sVar1 >= (short)auVar56._12_2_) * sVar1;
                uVar51 = (sVar9 < (short)auVar56._14_2_) * auVar56._14_2_ |
                         (ushort)(sVar9 >= (short)auVar56._14_2_) * sVar9;
                sVar9 = (-1 < (short)uVar40) * uVar40;
                sVar1 = (-1 < (short)uVar43) * uVar43;
                auVar33._2_2_ = sVar1;
                auVar33._0_2_ = sVar9;
                sVar2 = (-1 < (short)uVar44) * uVar44;
                auVar33._4_2_ = sVar2;
                sVar53 = (-1 < (short)uVar45) * uVar45;
                auVar33._6_2_ = sVar53;
                sVar3 = (-1 < (short)uVar46) * uVar46;
                auVar33._8_2_ = sVar3;
                sVar41 = (-1 < (short)uVar48) * uVar48;
                auVar33._10_2_ = sVar41;
                sVar52 = (-1 < (short)uVar50) * uVar50;
                auVar33._12_2_ = sVar52;
                sVar4 = (-1 < (short)uVar51) * uVar51;
                auVar33._14_2_ = sVar4;
                *(undefined1 (*) [16])((long)*b_00 + sVar18) = auVar33;
                uVar77 = (ushort)(sVar9 < (short)uVar77) * sVar9 | (sVar9 >= (short)uVar77) * uVar77
                ;
                uVar78 = (ushort)(sVar1 < (short)uVar78) * sVar1 | (sVar1 >= (short)uVar78) * uVar78
                ;
                uVar79 = (ushort)(sVar2 < (short)uVar79) * sVar2 | (sVar2 >= (short)uVar79) * uVar79
                ;
                uVar80 = (ushort)(sVar53 < (short)uVar80) * sVar53 |
                         (sVar53 >= (short)uVar80) * uVar80;
                uVar81 = (ushort)(sVar3 < (short)uVar81) * sVar3 | (sVar3 >= (short)uVar81) * uVar81
                ;
                uVar82 = (ushort)(sVar41 < (short)uVar82) * sVar41 |
                         (sVar41 >= (short)uVar82) * uVar82;
                uVar83 = (ushort)(sVar52 < (short)uVar83) * sVar52 |
                         (sVar52 >= (short)uVar83) * uVar83;
                uVar84 = (ushort)(sVar4 < (short)uVar84) * sVar4 | (sVar4 >= (short)uVar84) * uVar84
                ;
                uVar68 = (ushort)((short)uVar68 < sVar9) * sVar9 | ((short)uVar68 >= sVar9) * uVar68
                ;
                uVar70 = (ushort)((short)uVar70 < sVar1) * sVar1 | ((short)uVar70 >= sVar1) * uVar70
                ;
                uVar71 = (ushort)((short)uVar71 < sVar2) * sVar2 | ((short)uVar71 >= sVar2) * uVar71
                ;
                uVar72 = (ushort)((short)uVar72 < sVar53) * sVar53 |
                         ((short)uVar72 >= sVar53) * uVar72;
                uVar73 = (ushort)((short)uVar73 < sVar3) * sVar3 | ((short)uVar73 >= sVar3) * uVar73
                ;
                uVar74 = (ushort)((short)uVar74 < sVar41) * sVar41 |
                         ((short)uVar74 >= sVar41) * uVar74;
                uVar75 = (ushort)((short)uVar75 < sVar52) * sVar52 |
                         ((short)uVar75 >= sVar52) * uVar75;
                uVar76 = (ushort)((short)uVar76 < sVar4) * sVar4 | ((short)uVar76 >= sVar4) * uVar76
                ;
                uVar85 = (ushort)((short)uVar85 < sVar9) * sVar9 | ((short)uVar85 >= sVar9) * uVar85
                ;
                uVar86 = (ushort)((short)uVar86 < sVar1) * sVar1 | ((short)uVar86 >= sVar1) * uVar86
                ;
                uVar87 = (ushort)((short)uVar87 < sVar2) * sVar2 | ((short)uVar87 >= sVar2) * uVar87
                ;
                uVar88 = (ushort)((short)uVar88 < sVar53) * sVar53 |
                         ((short)uVar88 >= sVar53) * uVar88;
                uVar89 = (ushort)((short)uVar89 < sVar3) * sVar3 | ((short)uVar89 >= sVar3) * uVar89
                ;
                uVar90 = (ushort)((short)uVar90 < sVar41) * sVar41 |
                         ((short)uVar90 >= sVar41) * uVar90;
                uVar91 = (ushort)((short)uVar91 < sVar52) * sVar52 |
                         ((short)uVar91 >= sVar52) * uVar91;
                uVar92 = (ushort)((short)uVar92 < sVar4) * sVar4 | ((short)uVar92 >= sVar4) * uVar92
                ;
              }
              auVar34._0_2_ = -(ushort)((short)local_e8 < (short)uVar85);
              auVar34._2_2_ = -(ushort)((short)uStack_e6 < (short)uVar86);
              auVar34._4_2_ = -(ushort)((short)uVar23 < (short)uVar87);
              auVar34._6_2_ = -(ushort)((short)uVar37 < (short)uVar88);
              auVar34._8_2_ = -(ushort)((short)uVar38 < (short)uVar89);
              auVar34._10_2_ = -(ushort)((short)uVar39 < (short)uVar90);
              auVar34._12_2_ = -(ushort)((short)uVar47 < (short)uVar91);
              auVar34._14_2_ = -(ushort)((short)uVar49 < (short)uVar92);
              if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34._14_2_ >> 7 & 1) != 0) || (auVar34._14_2_ & 0x8000) != 0) {
                uVar23 = ((short)uVar89 < (short)uVar85) * uVar85 |
                         ((short)uVar89 >= (short)uVar85) * uVar89;
                uVar37 = ((short)uVar90 < (short)uVar86) * uVar86 |
                         ((short)uVar90 >= (short)uVar86) * uVar90;
                uVar38 = ((short)uVar91 < (short)uVar87) * uVar87 |
                         ((short)uVar91 >= (short)uVar87) * uVar91;
                uVar39 = ((short)uVar92 < (short)uVar88) * uVar88 |
                         ((short)uVar92 >= (short)uVar88) * uVar92;
                sVar53 = (0 < (short)uVar89) * uVar89;
                sVar41 = (0 < (short)uVar90) * uVar90;
                sVar52 = (0 < (short)uVar91) * uVar91;
                sVar4 = (0 < (short)uVar92) * uVar92;
                uVar23 = ((short)uVar38 < (short)uVar23) * uVar23 |
                         ((short)uVar38 >= (short)uVar23) * uVar38;
                uVar37 = ((short)uVar39 < (short)uVar37) * uVar37 |
                         ((short)uVar39 >= (short)uVar37) * uVar39;
                uVar38 = (sVar53 < (short)uVar38) * uVar38 |
                         (ushort)(sVar53 >= (short)uVar38) * sVar53;
                uVar39 = (sVar41 < (short)uVar39) * uVar39 |
                         (ushort)(sVar41 >= (short)uVar39) * sVar41;
                uVar47 = (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
                uVar49 = (ushort)(sVar4 < sVar41) * sVar41 | (ushort)(sVar4 >= sVar41) * sVar4;
                sVar52 = (ushort)(0 < sVar52) * sVar52;
                sVar4 = (ushort)(0 < sVar4) * sVar4;
                auVar35._0_4_ =
                     CONCAT22(((short)uVar38 < (short)uVar37) * uVar37 |
                              ((short)uVar38 >= (short)uVar37) * uVar38,
                              ((short)uVar37 < (short)uVar23) * uVar23 |
                              ((short)uVar37 >= (short)uVar23) * uVar37);
                auVar35._4_2_ =
                     ((short)uVar39 < (short)uVar38) * uVar38 |
                     ((short)uVar39 >= (short)uVar38) * uVar39;
                auVar35._6_2_ =
                     ((short)uVar47 < (short)uVar39) * uVar39 |
                     ((short)uVar47 >= (short)uVar39) * uVar47;
                auVar35._8_2_ =
                     ((short)uVar49 < (short)uVar47) * uVar47 |
                     ((short)uVar49 >= (short)uVar47) * uVar49;
                auVar35._10_2_ =
                     (sVar52 < (short)uVar49) * uVar49 | (ushort)(sVar52 >= (short)uVar49) * sVar52;
                auVar35._12_2_ =
                     (ushort)(sVar4 < sVar52) * sVar52 | (ushort)(sVar4 >= sVar52) * sVar4;
                auVar35._14_2_ = (ushort)(0 < sVar4) * sVar4;
                auVar27 = pshuflw(auVar35,auVar35,0);
                memcpy(ptr_00,b_00,__n);
                local_e8 = auVar27._0_2_;
                uStack_e6 = auVar27._2_2_;
                uVar19 = uVar21 & 0xffffffff;
                uVar23 = local_e8;
                uVar37 = uStack_e6;
                uVar38 = local_e8;
                uVar39 = uStack_e6;
                uVar47 = local_e8;
                uVar49 = uStack_e6;
                local_124 = auVar35._0_4_;
              }
            }
            uVar19 = 0;
            sVar53 = (short)local_124;
            while( true ) {
              iVar17 = (int)uVar12;
              if ((uVar20 & 0xfffffff) << 3 == (uint)uVar19) break;
              if ((*(short *)((long)*ptr_00 + uVar19 * 2) == sVar53) &&
                 (uVar14 = ((uint)uVar19 & 7) * uVar20 + ((uint)(uVar19 >> 3) & 0x1fffffff),
                 (int)uVar14 < iVar17)) {
                uVar12 = (ulong)uVar14;
              }
              uVar19 = uVar19 + 1;
            }
            auVar36._0_2_ = -(ushort)((short)uVar77 < (short)local_f8);
            auVar36._2_2_ = -(ushort)((short)uVar78 < (short)uStack_f6);
            auVar36._4_2_ = -(ushort)((short)uVar79 < (short)local_f8);
            auVar36._6_2_ = -(ushort)((short)uVar80 < (short)uStack_f6);
            auVar36._8_2_ = -(ushort)((short)uVar81 < (short)local_f8);
            auVar36._10_2_ = -(ushort)((short)uVar82 < (short)uStack_f6);
            auVar36._12_2_ = -(ushort)((short)uVar83 < (short)local_f8);
            auVar36._14_2_ = -(ushort)((short)uVar84 < (short)uStack_f6);
            auVar69._0_2_ = -(ushort)((short)local_88 < (short)uVar68);
            auVar69._2_2_ = -(ushort)((short)uStack_86 < (short)uVar70);
            auVar69._4_2_ = -(ushort)((short)local_88 < (short)uVar71);
            auVar69._6_2_ = -(ushort)((short)uStack_86 < (short)uVar72);
            auVar69._8_2_ = -(ushort)((short)local_88 < (short)uVar73);
            auVar69._10_2_ = -(ushort)((short)uStack_86 < (short)uVar74);
            auVar69._12_2_ = -(ushort)((short)local_88 < (short)uVar75);
            auVar69._14_2_ = -(ushort)((short)uStack_86 < (short)uVar76);
            auVar69 = auVar69 | auVar36;
            if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar69 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar69 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar69 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar69 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar69[0xf] < '\0') {
              *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
              sVar53 = 0;
              iVar15 = 0;
              iVar17 = 0;
            }
            ppVar13->score = (int)sVar53;
            ppVar13->end_query = iVar17;
            ppVar13->end_ref = iVar15;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar13;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_scan_profile_sse2_128_16",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}